

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O0

int LZ4_decompress_fast(char *source,char *dest,int originalSize)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  U16 UVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  ulong uVar8;
  BYTE *src;
  BYTE *pBVar9;
  int originalSize_local;
  char *dest_local;
  char *source_local;
  BYTE *oCopyLimit;
  int dec64;
  BYTE *copyFrom;
  BYTE *endOfMatch;
  size_t restSize;
  size_t copySize;
  uint s_1;
  uint s;
  uint token;
  size_t offset;
  BYTE *match;
  size_t length;
  int checkOffset;
  int safeDecode;
  int dec64table [8];
  uint dec32table [8];
  BYTE *dictEnd;
  BYTE *lowLimit;
  BYTE *oexit;
  BYTE *cpy;
  BYTE *oend;
  BYTE *op;
  BYTE *iend;
  BYTE *ip;
  int local_c;
  
  pBVar6 = (BYTE *)(dest + originalSize);
  dec64table[6] = 0;
  dec64table[7] = 1;
  _checkOffset = 0;
  dec64table[0] = 0;
  dec64table[1] = -1;
  dec64table[2] = 0;
  dec64table[3] = 1;
  dec64table[4] = 2;
  dec64table[5] = 3;
  pBVar9 = (BYTE *)dest;
  iend = (BYTE *)source;
  if (originalSize == 0) {
    local_c = -1;
    if (*source == '\0') {
      local_c = 1;
    }
  }
  else {
    while( true ) {
      oend = pBVar9;
      pBVar9 = iend + 1;
      bVar1 = *iend;
      match = (BYTE *)(ulong)(bVar1 >> 4);
      iend = pBVar9;
      if (match == (BYTE *)0xf) {
        match = (BYTE *)0xf;
        do {
          pBVar9 = iend + 1;
          bVar2 = *iend;
          match = match + (uint)bVar2;
          iend = pBVar9;
        } while (bVar2 == 0xff);
      }
      pBVar7 = oend + (long)match;
      if (pBVar6 + -8 < pBVar7) break;
      LZ4_wildCopy(oend,iend,pBVar7);
      pBVar9 = match + (long)iend;
      UVar5 = LZ4_readLE16(pBVar9);
      uVar8 = (ulong)UVar5;
      src = pBVar7 + -uVar8;
      LZ4_write32(pBVar7,(uint)UVar5);
      match = (BYTE *)(ulong)(bVar1 & 0xf);
      iend = pBVar9 + 2;
      if (match == (BYTE *)0xf) {
        match = (BYTE *)0xf;
        do {
          pBVar9 = iend + 1;
          bVar1 = *iend;
          match = match + (uint)bVar1;
          iend = pBVar9;
        } while (bVar1 == 0xff);
      }
      pBVar9 = pBVar7 + (long)(match + 4);
      if (uVar8 < 8) {
        iVar3 = (&checkOffset)[uVar8];
        *pBVar7 = *src;
        pBVar7[1] = src[1];
        pBVar7[2] = src[2];
        pBVar7[3] = src[3];
        uVar4 = dec64table[uVar8 + 6];
        *(undefined4 *)(pBVar7 + 4) = *(undefined4 *)(src + uVar4);
        offset = (long)(src + uVar4) - (long)iVar3;
      }
      else {
        LZ4_copy8(pBVar7,src);
        offset = (size_t)(src + 8);
      }
      oend = pBVar7 + 8;
      if (pBVar6 + -0xc < pBVar9) {
        pBVar7 = pBVar6 + -7;
        if (pBVar6 + -5 < pBVar9) goto LAB_00114058;
        if (oend < pBVar7) {
          LZ4_wildCopy(oend,(void *)offset,pBVar7);
          offset = (size_t)(pBVar7 + (offset - (long)oend));
          oend = pBVar7;
        }
        while (oend < pBVar9) {
          *oend = *(BYTE *)offset;
          offset = offset + 1;
          oend = oend + 1;
        }
      }
      else {
        LZ4_copy8(oend,(void *)offset);
        if ((BYTE *)0x10 < match + 4) {
          LZ4_wildCopy(pBVar7 + 0x10,(void *)(offset + 8),pBVar9);
        }
      }
    }
    if (pBVar7 == pBVar6) {
      memcpy(oend,iend,(size_t)match);
      return ((int)match + (int)iend) - (int)source;
    }
LAB_00114058:
    local_c = -1 - ((int)iend - (int)source);
  }
  return local_c;
}

Assistant:

int LZ4_decompress_fast(const char* source, char* dest, int originalSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize, endOnOutputSize, full, 0, withPrefix64k, (BYTE*)(dest - 64 KB), NULL, 64 KB);
}